

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<IsStringTest,_testing::internal::TemplateSel<IsStringTest_IsString_Test>,_testing::internal::Types1<char32_t>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  TestFactoryBase *factory;
  char *__rhs;
  char *str;
  allocator local_125;
  int index_local;
  char *local_120 [4];
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  index_local = index;
  std::__cxx11::string::string((string *)&local_40,prefix,&local_125);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = "";
  }
  std::operator+(&local_c0,&local_40,__rhs);
  std::operator+(&local_a0,&local_c0,case_name);
  std::operator+(&local_80,&local_a0,"/");
  StreamableToString<int>(&local_e0,&index_local);
  std::operator+(&local_60,&local_80,&local_e0);
  GetPrefixUntilComma_abi_cxx11_(&local_100,(internal *)test_names,str);
  GetTypeName<char32_t>();
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001bbea0;
  MakeAndRegisterTestInfo
            (local_60._M_dataplus._M_p,local_100._M_dataplus._M_p,local_120[0],(char *)0x0,
             &TypeIdHelper<IsStringTest<char32_t>>::dummy_,Test::SetUpTestCase,
             Test::TearDownTestCase,factory);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name + "/"
         + StreamableToString(index)).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }